

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtsStreamReader.cpp
# Opt level: O0

int __thiscall DTSStreamReader::getSurroundModeCode(DTSStreamReader *this)

{
  int local_14;
  int rez;
  DTSStreamReader *this_local;
  
  local_14 = 0;
  if (((((this->pi_channels_conf & 2U) == 0) || ((this->pi_channels_conf & 4U) == 0)) ||
      ((this->pi_channels_conf & 1U) == 0)) ||
     (((this->pi_channels_conf & 0x20U) == 0 || ((this->pi_channels_conf & 0x40U) == 0)))) {
    if ((((this->pi_channels_conf & 2U) == 0) ||
        (((this->pi_channels_conf & 4U) == 0 || ((this->pi_channels_conf & 0x20U) == 0)))) ||
       ((this->pi_channels_conf & 0x40U) == 0)) {
      if (((((this->pi_channels_conf & 2U) == 0) || ((this->pi_channels_conf & 4U) == 0)) ||
          ((this->pi_channels_conf & 1U) == 0)) ||
         ((((this->pi_channels_conf & 0x20U) == 0 && ((this->pi_channels_conf & 0x40U) == 0)) &&
          ((this->pi_channels_conf & 0x10U) == 0)))) {
        if ((((this->pi_channels_conf & 2U) == 0) || ((this->pi_channels_conf & 4U) == 0)) ||
           (((this->pi_channels_conf & 0x20U) == 0 &&
            (((this->pi_channels_conf & 0x40U) == 0 && ((this->pi_channels_conf & 0x10U) == 0))))))
        {
          if (((this->pi_channels_conf & 2U) == 0) ||
             (((this->pi_channels_conf & 4U) == 0 || ((this->pi_channels_conf & 1U) == 0)))) {
            if (((this->pi_channels_conf & 2U) != 0) && ((this->pi_channels_conf & 4U) != 0)) {
              local_14 = 2;
            }
          }
          else {
            local_14 = 5;
          }
        }
        else {
          local_14 = 6;
        }
      }
      else {
        local_14 = 7;
      }
    }
    else {
      local_14 = 8;
    }
  }
  else {
    local_14 = 9;
  }
  return local_14;
}

Assistant:

int DTSStreamReader::getSurroundModeCode() const
{
    int rez = 0;
    if ((pi_channels_conf & AOUT_CHAN_LEFT) && (pi_channels_conf & AOUT_CHAN_RIGHT) &&
        (pi_channels_conf & AOUT_CHAN_CENTER) && (pi_channels_conf & AOUT_CHAN_REARLEFT) &&
        (pi_channels_conf & AOUT_CHAN_REARRIGHT))
        rez = 0x09;
    else if ((pi_channels_conf & AOUT_CHAN_LEFT) && (pi_channels_conf & AOUT_CHAN_RIGHT) &&
             (pi_channels_conf & AOUT_CHAN_REARLEFT) && (pi_channels_conf & AOUT_CHAN_REARRIGHT))
        rez = 0x08;
    else if ((pi_channels_conf & AOUT_CHAN_LEFT) && (pi_channels_conf & AOUT_CHAN_RIGHT) &&
             (pi_channels_conf & AOUT_CHAN_CENTER) &&
             ((pi_channels_conf & AOUT_CHAN_REARLEFT) || (pi_channels_conf & AOUT_CHAN_REARRIGHT) ||
              (pi_channels_conf & AOUT_CHAN_REARCENTER)))
        rez = 0x07;
    else if ((pi_channels_conf & AOUT_CHAN_LEFT) && (pi_channels_conf & AOUT_CHAN_RIGHT) &&
             ((pi_channels_conf & AOUT_CHAN_REARLEFT) || (pi_channels_conf & AOUT_CHAN_REARRIGHT) ||
              (pi_channels_conf & AOUT_CHAN_REARCENTER)))
        rez = 0x06;
    else if ((pi_channels_conf & AOUT_CHAN_LEFT) && (pi_channels_conf & AOUT_CHAN_RIGHT) &&
             (pi_channels_conf & AOUT_CHAN_CENTER))
        rez = 0x05;
    else if ((pi_channels_conf & AOUT_CHAN_LEFT) && (pi_channels_conf & AOUT_CHAN_RIGHT))
        rez = 0x02;
    return rez;
}